

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O2

string * __thiscall
re2::FormatKind_abi_cxx11_(string *__return_storage_ptr__,re2 *this,MatchKind kind)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "first match";
    paVar1 = &local_b;
    break;
  case 1:
    pcVar2 = "longest match";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "full match";
    paVar1 = &local_9;
    break;
  case 3:
    pcVar2 = "many match";
    paVar1 = &local_c;
    break;
  default:
    pcVar2 = "???";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

static string FormatKind(Prog::MatchKind kind) {
  switch (kind) {
    case Prog::kFullMatch:
      return "full match";
    case Prog::kLongestMatch:
      return "longest match";
    case Prog::kFirstMatch:
      return "first match";
    case Prog::kManyMatch:
      return "many match";
  }
  return "???";
}